

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp_write_nonblock.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  int __fd;
  int iVar4;
  FILE *__stream;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  time_t tVar9;
  ssize_t nwritten;
  char *err_msg;
  size_t prev;
  char *pcStack_19118;
  int duration;
  libssh2_struct_stat_size total;
  time_t start;
  stat fileinfo;
  char *ptr;
  size_t nread;
  char mem [102400];
  FILE *local;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *session;
  int rc;
  char *fingerprint;
  sockaddr_in sin;
  int auth_pw;
  int i;
  libssh2_socket_t sock;
  uint32_t hostaddr;
  char **argv_local;
  int argc_local;
  
  sin.sin_zero[0] = '\x01';
  sin.sin_zero[1] = '\0';
  sin.sin_zero[2] = '\0';
  sin.sin_zero[3] = '\0';
  channel = (LIBSSH2_CHANNEL *)0x0;
  pcStack_19118 = (char *)0x0;
  if (argc < 2) {
    i = htonl(0x7f000001);
  }
  else {
    i = inet_addr(argv[1]);
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  if (4 < argc) {
    loclfile = argv[4];
  }
  if (5 < argc) {
    scppath = argv[5];
  }
  uVar3 = libssh2_init(0);
  if (uVar3 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar3);
    return 1;
  }
  __stream = fopen(loclfile,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Cannot open local file %s\n",loclfile);
    return 1;
  }
  stat(loclfile,(stat *)&start);
  __fd = socket(2,1,0);
  if (__fd == -1) {
    fprintf(_stderr,"failed to create socket.\n");
  }
  else {
    fingerprint._0_2_ = 2;
    fingerprint._2_2_ = htons(0x16);
    fingerprint._4_4_ = i;
    iVar4 = connect(__fd,(sockaddr *)&fingerprint,0x10);
    if (iVar4 == 0) {
      channel = (LIBSSH2_CHANNEL *)libssh2_session_init_ex(0,0,0);
      if (channel == (LIBSSH2_CHANNEL *)0x0) {
        fprintf(_stderr,"Could not initialize SSH session.\n");
      }
      else {
        libssh2_session_set_blocking(channel,0);
        do {
          uVar3 = libssh2_session_handshake(channel,__fd);
        } while (uVar3 == 0xffffffdb);
        if (uVar3 == 0) {
          lVar5 = libssh2_hostkey_hash(channel,2);
          fprintf(_stderr,"Fingerprint: ");
          sin.sin_zero[4] = '\0';
          sin.sin_zero[5] = '\0';
          sin.sin_zero[6] = '\0';
          sin.sin_zero[7] = '\0';
          for (; (int)sin.sin_zero._4_4_ < 0x14; sin.sin_zero._4_4_ = sin.sin_zero._4_4_ + 1) {
            fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar5 + (int)sin.sin_zero._4_4_));
          }
          fprintf(_stderr,"\n");
          if (sin.sin_zero._0_4_ == 0) {
            do {
              pcVar1 = username;
              sVar6 = strlen(username);
              iVar4 = libssh2_userauth_publickey_fromfile_ex
                                (channel,pcVar1,sVar6 & 0xffffffff,pubkey,privkey,password);
            } while (iVar4 == -0x25);
            if (iVar4 != 0) {
              fprintf(_stderr,"Authentication by public key failed.\n");
              goto LAB_00101a03;
            }
          }
          else {
            do {
              pcVar1 = username;
              sVar6 = strlen(username);
              pcVar2 = password;
              sVar7 = strlen(password);
              iVar4 = libssh2_userauth_password_ex
                                (channel,pcVar1,sVar6 & 0xffffffff,pcVar2,sVar7 & 0xffffffff,0);
            } while (iVar4 == -0x25);
            if (iVar4 != 0) {
              fprintf(_stderr,"Authentication by password failed.\n");
              goto LAB_00101a03;
            }
          }
          do {
            lVar5 = libssh2_scp_send_ex(channel,scppath,(uint)fileinfo.st_nlink & 0x1ff,
                                        fileinfo.st_rdev,0);
            if ((lVar5 == 0) && (iVar4 = libssh2_session_last_errno(channel), iVar4 != -0x25)) {
              libssh2_session_last_error(channel,&nwritten,0,0);
              fprintf(_stderr,"%s\n",nwritten);
              goto LAB_00101a03;
            }
          } while (lVar5 == 0);
          fprintf(_stderr,"SCP session waiting to send file\n");
          total = time((time_t *)0x0);
          do {
            ptr = (char *)fread(&nread,1,0x19000,__stream);
            if (ptr == (char *)0x0) break;
            fileinfo.__glibc_reserved[2] = (__syscall_slong_t)&nread;
            pcStack_19118 = ptr + (long)pcStack_19118;
            err_msg = (char *)0x0;
            do {
              while (lVar8 = libssh2_channel_write_ex(lVar5,0,fileinfo.__glibc_reserved[2],ptr),
                    lVar8 == -0x25) {
                waitsocket(__fd,(LIBSSH2_SESSION *)channel);
                err_msg = (char *)0x0;
              }
              if (lVar8 < 0) {
                fprintf(_stderr,"ERROR %ld total %ld / %lu prev %lu\n",lVar8,pcStack_19118,ptr,
                        err_msg);
                break;
              }
              err_msg = ptr;
              fileinfo.__glibc_reserved[2] = lVar8 + fileinfo.__glibc_reserved[2];
              ptr = ptr + -lVar8;
            } while (ptr != (char *)0x0);
          } while (ptr == (char *)0x0);
          tVar9 = time((time_t *)0x0);
          prev._4_4_ = (int)tVar9 - (int)total;
          fprintf(_stderr,"%ld bytes in %d seconds makes %.1f bytes/sec\n",
                  (double)(long)pcStack_19118 / (double)(int)prev._4_4_,pcStack_19118,
                  (ulong)prev._4_4_);
          fprintf(_stderr,"Sending EOF\n");
          do {
            iVar4 = libssh2_channel_send_eof(lVar5);
          } while (iVar4 == -0x25);
          fprintf(_stderr,"Waiting for EOF\n");
          do {
            iVar4 = libssh2_channel_wait_eof(lVar5);
          } while (iVar4 == -0x25);
          fprintf(_stderr,"Waiting for channel to close\n");
          do {
            iVar4 = libssh2_channel_wait_closed(lVar5);
          } while (iVar4 == -0x25);
          libssh2_channel_free(lVar5);
        }
        else {
          fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar3);
        }
      }
    }
    else {
      fprintf(_stderr,"failed to connect.\n");
    }
  }
LAB_00101a03:
  if (channel != (LIBSSH2_CHANNEL *)0x0) {
    do {
      iVar4 = libssh2_session_disconnect_ex(channel,0xb,"Normal Shutdown","");
    } while (iVar4 == -0x25);
    libssh2_session_free(channel);
  }
  if (__fd != -1) {
    shutdown(__fd,2);
    close(__fd);
  }
  fprintf(_stderr,"all done\n");
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 1;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    FILE *local;
    char mem[1024 * 100];
    size_t nread;
    char *ptr;
    struct stat fileinfo;
    time_t start;
    libssh2_struct_stat_size total = 0;
    int duration;
    size_t prev;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        loclfile = argv[4];
    }
    if(argc > 5) {
        scppath = argv[5];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    local = fopen(loclfile, "rb");
    if(!local) {
        fprintf(stderr, "Cannot open local file %s\n", loclfile);
        return 1;
    }

    stat(loclfile, &fileinfo);

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* Since we have set non-blocking, tell libssh2 we are non-blocking */
    libssh2_session_set_blocking(session, 0);

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    while((rc = libssh2_session_handshake(session, sock)) ==
          LIBSSH2_ERROR_EAGAIN);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    if(auth_pw) {
        /* We could authenticate via password */
        while((rc = libssh2_userauth_password(session, username, password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by password failed.\n");
            goto shutdown;
        }
    }
    else {
        /* Or by public key */
        while((rc = libssh2_userauth_publickey_fromfile(session, username,
                                                        pubkey, privkey,
                                                        password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by public key failed.\n");
            goto shutdown;
        }
    }

    /* Send a file via scp. The mode parameter must only have permissions! */
    do {
        channel = libssh2_scp_send(session, scppath, fileinfo.st_mode & 0777,
                                   (size_t)fileinfo.st_size);

        if(!channel &&
           libssh2_session_last_errno(session) != LIBSSH2_ERROR_EAGAIN) {
            char *err_msg;

            libssh2_session_last_error(session, &err_msg, NULL, 0);
            fprintf(stderr, "%s\n", err_msg);
            goto shutdown;
        }
    } while(!channel);

    fprintf(stderr, "SCP session waiting to send file\n");
    start = time(NULL);
    do {
        nread = fread(mem, 1, sizeof(mem), local);
        if(nread <= 0) {
            /* end of file */
            break;
        }
        ptr = mem;

        total += (libssh2_struct_stat_size)nread;

        prev = 0;
        do {
            ssize_t nwritten;
            while((nwritten = libssh2_channel_write(channel, ptr, nread)) ==
                  LIBSSH2_ERROR_EAGAIN) {
                waitsocket(sock, session);
                prev = 0;
            }
            if(nwritten < 0) {
                fprintf(stderr, "ERROR %ld total %ld / %lu prev %lu\n",
                        (long)nwritten, (long)total,
                        (unsigned long)nread, (unsigned long)prev);
                break;
            }
            else {
                prev = nread;

                /* nwritten indicates how many bytes were written this time */
                ptr += nwritten;
                nread -= (size_t)nwritten;
            }
        } while(nread);
    } while(!nread); /* only continue if nread was drained */

    duration = (int)(time(NULL) - start);

    fprintf(stderr, "%ld bytes in %d seconds makes %.1f bytes/sec\n",
           (long)total, duration, (double)total / duration);

    fprintf(stderr, "Sending EOF\n");
    while(libssh2_channel_send_eof(channel) == LIBSSH2_ERROR_EAGAIN);

    fprintf(stderr, "Waiting for EOF\n");
    while(libssh2_channel_wait_eof(channel) == LIBSSH2_ERROR_EAGAIN);

    fprintf(stderr, "Waiting for channel to close\n");
    while(libssh2_channel_wait_closed(channel) == LIBSSH2_ERROR_EAGAIN);

    libssh2_channel_free(channel);
    channel = NULL;

shutdown:

    if(session) {
        while(libssh2_session_disconnect(session, "Normal Shutdown") ==
              LIBSSH2_ERROR_EAGAIN);
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}